

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  pointer pcVar3;
  ulong uVar4;
  int iVar5;
  string *psVar6;
  ModuleDefinitionInfo *path;
  char *pcVar7;
  ostream *poVar8;
  pointer ppcVar9;
  pointer pbVar10;
  pointer pbVar11;
  string objlist_file;
  string cmd;
  cmGeneratedFileStream fout;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [584];
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,psVar6);
  if ((path != (ModuleDefinitionInfo *)0x0) && (path->DefFileGenerated == true)) {
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    pcVar1 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,pcVar1,pcVar1 + psVar6->_M_string_length);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_278,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2d8,SHELL);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_278);
    pcVar1 = local_278 + 0x10;
    if ((pointer)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    std::__cxx11::string::append((char *)&local_2d8);
    pcVar2 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::__cxx11::string::string((string *)&local_2b8,pcVar7,(allocator *)&local_298);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_2f8,pcVar2,&local_2b8,&path->DefFile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_278,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2f8,SHELL);
    std::__cxx11::string::_M_append((char *)&local_2d8,local_278._0_8_);
    if ((pointer)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_2d8);
    pcVar3 = (path->DefFile)._M_dataplus._M_p;
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,pcVar3,pcVar3 + (path->DefFile)._M_string_length);
    std::__cxx11::string::append((char *)&local_2f8);
    pcVar2 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::__cxx11::string::string((string *)&local_298,pcVar7,&local_2f9);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_2b8,pcVar2,&local_298,&local_2f8);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_278,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2b8,SHELL);
    std::__cxx11::string::_M_append((char *)&local_2d8,local_278._0_8_);
    if ((pointer)local_278._0_8_ != pcVar1) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(real_link_commands,
             (real_link_commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_2d8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,local_2f8._M_dataplus._M_p,false,None);
    if (path->WindowsExportAllSymbols == true) {
      pbVar11 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (this->Objects).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar11;
          pbVar10 = pbVar10 + 1) {
        uVar4 = pbVar10->_M_string_length;
        if (3 < uVar4) {
          pcVar7 = (pbVar10->_M_dataplus)._M_p;
          iVar5 = strcmp(pcVar7 + (uVar4 - 4),".obj");
          if (iVar5 == 0) {
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_278,pcVar7,uVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            pbVar11 = (this->Objects).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
      }
      pbVar10 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar10 !=
          (this->ExternalObjects).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,(pbVar10->_M_dataplus)._M_p,
                              pbVar10->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 (this->ExternalObjects).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    ppcVar9 = (path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppcVar9 !=
        (path->Sources).
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar9);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        ppcVar9 = ppcVar9 + 1;
      } while (ppcVar9 !=
               (path->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd =
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
  cmd += " -E __create_def ";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), mdi->DefFile),
    cmOutputConverter::SHELL);
  cmd += " ";
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), objlist_file),
    cmOutputConverter::SHELL);
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file.c_str());

  if (mdi->WindowsExportAllSymbols) {
    for (std::vector<std::string>::const_iterator i = this->Objects.begin();
         i != this->Objects.end(); ++i) {
      if (cmHasLiteralSuffix(*i, ".obj")) {
        fout << *i << "\n";
      }
    }
    for (std::vector<std::string>::const_iterator i =
           this->ExternalObjects.begin();
         i != this->ExternalObjects.end(); ++i) {
      fout << *i << "\n";
    }
  }

  for (std::vector<cmSourceFile const*>::const_iterator i =
         mdi->Sources.begin();
       i != mdi->Sources.end(); ++i) {
    fout << (*i)->GetFullPath() << "\n";
  }
}